

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O2

boolean e_missed(entity *etmp,boolean chunks)

{
  int iVar1;
  boolean bVar2;
  int iVar3;
  
  bVar2 = automiss(etmp);
  if (bVar2 != '\0') {
    return '\x01';
  }
  if ((etmp->edata->mflags1 & 1) == 0) {
LAB_0015d8c4:
    iVar3 = 3;
    if ((etmp->edata->mlet != '\x05') &&
       ((etmp->emon != &youmonst ||
        ((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0 &&
         ((youmonst.data)->mlet != '\x05')))))) {
      if ((chunks == '\0') || (bVar2 = is_pool(level,etmp->ex,etmp->ey), bVar2 == '\0')) {
        iVar3 = 0;
      }
      else {
        iVar3 = 2;
      }
    }
  }
  else {
    if (etmp->emon == &youmonst) {
      if (u.uprops[0x1f].extrinsic != 0 || u.uprops[0x1f].intrinsic != 0) goto LAB_0015d8c4;
    }
    else if ((*(uint *)&etmp->emon->field_0x60 & 0xc0000) != 0x40000) goto LAB_0015d8c4;
    iVar3 = 5;
  }
  iVar1 = iVar3 + -3;
  if (level->locations[etmp->ex][etmp->ey].typ != '\f') {
    iVar1 = iVar3;
  }
  iVar3 = rnd(8);
  return iVar3 <= iVar1;
}

Assistant:

static boolean e_missed(struct entity *etmp, boolean chunks)
{
	int misses;

	if (automiss(etmp))
		return TRUE;

	if (is_flyer(etmp->edata) &&
	    (is_u(etmp)? !Sleeping :
	     (etmp->emon->mcanmove && !etmp->emon->msleeping)))
						 /* flying requires mobility */
		misses = 5;	/* out of 8 */
	else if (is_floater(etmp->edata) ||
		    (is_u(etmp) && Levitation))	 /* doesn't require mobility */
		misses = 3;
	else if (chunks && is_pool(level, etmp->ex, etmp->ey))
		misses = 2;				    /* sitting ducks */
	else
		misses = 0;

	if (is_db_wall(etmp->ex, etmp->ey))
		misses -= 3;				    /* less airspace */


	return (boolean)((misses >= rnd(8))? TRUE : FALSE);
}